

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zerobytes.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int32_t *ptr;
  shm_key_t key;
  bad_shm_alloc ex;
  
  shm::gen_key(&key,0x2a);
  shm::init((EVP_PKEY_CTX *)key);
  shm::close((int)key);
  return 0;
}

Assistant:

int
main( int argc, char **argv )
{
   shm_key_t key;
   shm::gen_key( key, 42 );
   std::int32_t *ptr( nullptr );
   const auto nbytes( 0 );
   try
   {
      ptr = reinterpret_cast< std::int32_t* >( shm::init( key, nbytes ) );
   }
   catch( bad_shm_alloc ex )
   {
      /** this is where we wanted to end up **/
      std::cerr << ex.what() << "\n";
      exit( EXIT_SUCCESS );
   }
   /** if we get to this point then we assume that the mem is writable **/
   shm::close( key, 
               reinterpret_cast<void**>(&ptr), 
               nbytes,
               true,
               true );
   /** should get here and be done **/
   return( EXIT_SUCCESS );
}